

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::double_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this,
          size_t size,align_spec *spec,double_writer f)

{
  undefined1 uVar1;
  wchar_t wVar2;
  alignment aVar3;
  unsigned_long __n;
  char *pcVar4;
  char *pcVar5;
  align_spec *in_RDX;
  ulong in_RSI;
  size_t left_padding;
  size_t padding;
  char_type fill;
  type *it;
  uint width;
  char **in_stack_ffffffffffffff98;
  double_writer *this_00;
  char *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffc0;
  type local_38;
  type *local_30;
  type local_28;
  uint local_1c;
  align_spec *local_18;
  ulong local_10;
  
  this_00 = (double_writer *)&stack0x00000008;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_1c = align_spec::width(in_RDX);
  if (local_10 < local_1c) {
    local_38 = basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
               reserve((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                        *)this_00,(size_t)in_stack_ffffffffffffff98);
    local_30 = &local_38;
    wVar2 = align_spec::fill(local_18);
    uVar1 = (undefined1)wVar2;
    __n = local_1c - local_10;
    aVar3 = align_spec::align(local_18);
    if (aVar3 == ALIGN_RIGHT) {
      pcVar4 = std::fill_n<char*,unsigned_long,char>
                         ((char *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),__n,
                          in_stack_ffffffffffffffb0);
      *local_30 = pcVar4;
      double_writer::operator()(this_00,in_stack_ffffffffffffff98);
    }
    else {
      aVar3 = align_spec::align(local_18);
      if (aVar3 == ALIGN_CENTER) {
        pcVar4 = (char *)(__n >> 1);
        pcVar5 = std::fill_n<char*,unsigned_long,char>
                           ((char *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),__n,pcVar4);
        *local_30 = pcVar5;
        double_writer::operator()(this_00,in_stack_ffffffffffffff98);
        pcVar4 = std::fill_n<char*,unsigned_long,char>
                           ((char *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),__n,pcVar4);
        *local_30 = pcVar4;
      }
      else {
        double_writer::operator()(this_00,in_stack_ffffffffffffff98);
        pcVar4 = std::fill_n<char*,unsigned_long,char>
                           ((char *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),__n,
                            in_stack_ffffffffffffffb0);
        *local_30 = pcVar4;
      }
    }
  }
  else {
    local_28 = basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
               reserve((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                        *)this_00,(size_t)in_stack_ffffffffffffff98);
    double_writer::operator()(this_00,in_stack_ffffffffffffff98);
  }
  return;
}

Assistant:

void basic_writer<Range>::write_padded(
    std::size_t size, const align_spec &spec, F f) {
  unsigned width = spec.width();
  if (width <= size)
    return f(reserve(size));
  auto &&it = reserve(width);
  char_type fill = static_cast<char_type>(spec.fill());
  std::size_t padding = width - size;
  if (spec.align() == ALIGN_RIGHT) {
    it = std::fill_n(it, padding, fill);
    f(it);
  } else if (spec.align() == ALIGN_CENTER) {
    std::size_t left_padding = padding / 2;
    it = std::fill_n(it, left_padding, fill);
    f(it);
    it = std::fill_n(it, padding - left_padding, fill);
  } else {
    f(it);
    it = std::fill_n(it, padding, fill);
  }
}